

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveFromTermToCte(Parse *pParse,Walker *pWalker,SrcItem *pFrom)

{
  uint uVar1;
  uint uVar2;
  sqlite3 *db_00;
  undefined8 uVar3;
  SrcList *pSVar4;
  undefined8 uVar5;
  _func_int_Walker_ptr_Select_ptr *p_Var6;
  undefined8 uVar7;
  int iVar8;
  Table *p;
  void *pvVar9;
  char *pcVar10;
  Select *pSVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  int rc;
  SrcItem *pItem;
  SrcList *pSrc;
  Select *pSStack_88;
  int i;
  CteUse *pCteUse;
  int iRecTab;
  With *pSavedWith;
  Select *pSStack_68;
  int bMayRecursive;
  Select *pRecTerm;
  Select *pLeft;
  Select *pSel;
  ExprList *pEList;
  Table *pTab;
  sqlite3 *db;
  With *pWith;
  Cte *pCte;
  SrcItem *pFrom_local;
  Walker *pWalker_local;
  Parse *pParse_local;
  
  if (pParse->pWith == (With *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else if (pParse->nErr == 0) {
    if (pFrom->zDatabase == (char *)0x0) {
      if ((*(ushort *)&(pFrom->fg).field_0x1 >> 9 & 1) == 0) {
        pCte = (Cte *)pFrom;
        pFrom_local = (SrcItem *)pWalker;
        pWalker_local = (Walker *)pParse;
        pWith = (With *)searchWith(pParse->pWith,pFrom,(With **)&db);
        if (pWith == (With *)0x0) {
          pParse_local._4_4_ = 0;
        }
        else {
          db_00 = (sqlite3 *)pWalker_local->pParse;
          pCteUse._4_4_ = -1;
          if (pWith->a[0].pCols == (ExprList *)0x0) {
            iVar8 = cannotBeFunction((Parse *)pWalker_local,(SrcItem *)pCte);
            if (iVar8 == 0) {
              p = (Table *)sqlite3DbMallocZero(db_00,0x68);
              if (p == (Table *)0x0) {
                pParse_local._4_4_ = 2;
              }
              else {
                pSStack_88 = pWith->a[0].pSelect;
                if (pSStack_88 == (Select *)0x0) {
                  pSStack_88 = (Select *)sqlite3DbMallocZero(db_00,0x14);
                  pWith->a[0].pSelect = pSStack_88;
                  if ((pSStack_88 == (Select *)0x0) ||
                     (pvVar9 = sqlite3ParserAddCleanup
                                         ((Parse *)pWalker_local,sqlite3DbFree,pSStack_88),
                     pvVar9 == (void *)0x0)) {
                    sqlite3DbFree(db_00,p);
                    return 2;
                  }
                  *(undefined1 *)((long)&pSStack_88->selId + 2) =
                       *(undefined1 *)&pWith->a[0].zCteErr;
                }
                pCte->pUse = (CteUse *)p;
                p->nTabRef = 1;
                pcVar10 = sqlite3DbStrDup(db_00,*(char **)pWith);
                p->zName = pcVar10;
                p->iPKey = -1;
                p->nRowLogEst = 200;
                p->tabFlags = p->tabFlags | 0x4200;
                pSVar11 = sqlite3SelectDup(db_00,(Select *)pWith->a[0].zName,0);
                *(Select **)&pCte->eM10d = pSVar11;
                if (db_00->mallocFailed == '\0') {
                  *(uint *)(*(long *)&pCte->eM10d + 4) =
                       *(uint *)(*(long *)&pCte->eM10d + 4) | 0x4000000;
                  if ((*(ushort *)((long)&pCte[1].pCols + 5) >> 1 & 1) == 0) {
                    *(ushort *)((long)&pCte[1].pCols + 5) =
                         *(ushort *)((long)&pCte[1].pCols + 5) & 0xfeff | 0x100;
                    pCte[2].zName = (char *)pSStack_88;
                    *(int *)pSStack_88 = *(int *)pSStack_88 + 1;
                    iVar8._0_1_ = pSStack_88->op;
                    iVar8._1_1_ = pSStack_88->field_0x1;
                    iVar8._2_2_ = pSStack_88->nSelectRow;
                    if ((1 < iVar8) && (*(char *)((long)&pSStack_88->selId + 2) == '\x01')) {
                      *(undefined1 *)((long)&pSStack_88->selId + 2) = 0;
                    }
                    pSVar11 = *(Select **)&pCte->eM10d;
                    bVar13 = true;
                    pSStack_68 = pSVar11;
                    if (pSVar11->op != 0x87) {
                      bVar13 = pSVar11->op == 0x86;
                    }
                    while( true ) {
                      bVar14 = false;
                      if (bVar13) {
                        bVar14 = pSStack_68->op == pSVar11->op;
                      }
                      if (!bVar14) break;
                      pSVar4 = pSStack_68->pSrc;
                      for (pSrc._4_4_ = 0; pSrc._4_4_ < pSVar4->nSrc; pSrc._4_4_ = pSrc._4_4_ + 1) {
                        lVar12 = (long)pSrc._4_4_;
                        if (((pSVar4->a[lVar12].zDatabase == (char *)0x0) &&
                            (pSVar4->a[lVar12].zName != (char *)0x0)) &&
                           (iVar8 = sqlite3StrICmp(pSVar4->a[lVar12].zName,*(char **)pWith),
                           iVar8 == 0)) {
                          pSVar4->a[lVar12].pTab = p;
                          p->nTabRef = p->nTabRef + 1;
                          *(ushort *)&pSVar4->a[lVar12].fg.field_0x1 =
                               *(ushort *)&pSVar4->a[lVar12].fg.field_0x1 & 0xffbf | 0x40;
                          if ((pSStack_68->selFlags & 0x2000) != 0) {
                            uVar5._0_4_ = pWith->nCte;
                            uVar5._4_4_ = pWith->bView;
                            sqlite3ErrorMsg((Parse *)pWalker_local,
                                            "multiple references to recursive table: %s",uVar5);
                            return 2;
                          }
                          pSStack_68->selFlags = pSStack_68->selFlags | 0x2000;
                          if (pCteUse._4_4_ < 0) {
                            pCteUse._4_4_ = *(int *)((long)&pWalker_local[1].pParse + 4);
                            *(int *)((long)&pWalker_local[1].pParse + 4) = pCteUse._4_4_ + 1;
                          }
                          pSVar4->a[lVar12].iCursor = pCteUse._4_4_;
                        }
                      }
                      if ((pSStack_68->selFlags & 0x2000) == 0) break;
                      pSStack_68 = pSStack_68->pPrior;
                    }
                    pWith->a[0].pCols = (ExprList *)"circular reference: %s";
                    p_Var6 = pWalker_local[8].xSelectCallback;
                    pWalker_local[8].xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)db;
                    if ((pSVar11->selFlags & 0x2000) == 0) {
                      iVar8 = sqlite3WalkSelect((Walker *)pFrom_local,pSVar11);
                      if (iVar8 != 0) {
                        pWalker_local[8].xSelectCallback = p_Var6;
                        return 2;
                      }
                    }
                    else {
                      pSStack_68->pWith = pSVar11->pWith;
                      iVar8 = sqlite3WalkSelect((Walker *)pFrom_local,pSStack_68);
                      pSStack_68->pWith = (With *)0x0;
                      if (iVar8 != 0) {
                        pWalker_local[8].xSelectCallback = p_Var6;
                        return 2;
                      }
                    }
                    pWalker_local[8].xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)db;
                    for (pRecTerm = pSVar11; pRecTerm->pPrior != (Select *)0x0;
                        pRecTerm = pRecTerm->pPrior) {
                    }
                    pSel = (Select *)pRecTerm->pEList;
                    if (pWith->pOuter != (With *)0x0) {
                      if ((pSel != (Select *)0x0) &&
                         (uVar1._0_1_ = pSel->op, uVar1._1_1_ = pSel->field_0x1,
                         uVar1._2_2_ = pSel->nSelectRow, uVar1 != pWith->pOuter->nCte)) {
                        uVar7._0_4_ = pWith->nCte;
                        uVar7._4_4_ = pWith->bView;
                        uVar2._0_1_ = pSel->op;
                        uVar2._1_1_ = pSel->field_0x1;
                        uVar2._2_2_ = pSel->nSelectRow;
                        sqlite3ErrorMsg((Parse *)pWalker_local,
                                        "table %s has %d values for %d columns",uVar7,(ulong)uVar2,
                                        (ulong)(uint)pWith->pOuter->nCte);
                        pWalker_local[8].xSelectCallback = p_Var6;
                        return 2;
                      }
                      pSel = (Select *)pWith->pOuter;
                    }
                    sqlite3ColumnsFromExprList
                              ((Parse *)pWalker_local,(ExprList *)pSel,&p->nCol,&p->aCol);
                    if (bVar13) {
                      if ((pSVar11->selFlags & 0x2000) == 0) {
                        pWith->a[0].pCols = (ExprList *)"recursive reference in a subquery: %s";
                      }
                      else {
                        pWith->a[0].pCols = (ExprList *)"multiple recursive references: %s";
                      }
                      sqlite3WalkSelect((Walker *)pFrom_local,pSVar11);
                    }
                    pWith->a[0].pCols = (ExprList *)0x0;
                    pWalker_local[8].xSelectCallback = p_Var6;
                    pParse_local._4_4_ = 1;
                  }
                  else {
                    sqlite3ErrorMsg((Parse *)pWalker_local,"no such index: \"%s\"",
                                    *(undefined8 *)&pCte[1].eM10d);
                    pParse_local._4_4_ = 2;
                  }
                }
                else {
                  pParse_local._4_4_ = 2;
                }
              }
            }
            else {
              pParse_local._4_4_ = 2;
            }
          }
          else {
            uVar3._0_4_ = pWith->nCte;
            uVar3._4_4_ = pWith->bView;
            sqlite3ErrorMsg((Parse *)pWalker_local,(char *)pWith->a[0].pCols,uVar3);
            pParse_local._4_4_ = 2;
          }
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int resolveFromTermToCte(
  Parse *pParse,                  /* The parsing context */
  Walker *pWalker,                /* Current tree walker */
  SrcItem *pFrom                  /* The FROM clause term to check */
){
  Cte *pCte;               /* Matched CTE (or NULL if no match) */
  With *pWith;             /* The matching WITH */

  assert( pFrom->pTab==0 );
  if( pParse->pWith==0 ){
    /* There are no WITH clauses in the stack.  No match is possible */
    return 0;
  }
  if( pParse->nErr ){
    /* Prior errors might have left pParse->pWith in a goofy state, so
    ** go no further. */
    return 0;
  }
  if( pFrom->zDatabase!=0 ){
    /* The FROM term contains a schema qualifier (ex: main.t1) and so
    ** it cannot possibly be a CTE reference. */
    return 0;
  }
  if( pFrom->fg.notCte ){
    /* The FROM term is specifically excluded from matching a CTE.
    **   (1)  It is part of a trigger that used to have zDatabase but had
    **        zDatabase removed by sqlite3FixTriggerStep().
    **   (2)  This is the first term in the FROM clause of an UPDATE.
    */
    return 0;
  }
  pCte = searchWith(pParse->pWith, pFrom, &pWith);
  if( pCte ){
    sqlite3 *db = pParse->db;
    Table *pTab;
    ExprList *pEList;
    Select *pSel;
    Select *pLeft;                /* Left-most SELECT statement */
    Select *pRecTerm;             /* Left-most recursive term */
    int bMayRecursive;            /* True if compound joined by UNION [ALL] */
    With *pSavedWith;             /* Initial value of pParse->pWith */
    int iRecTab = -1;             /* Cursor for recursive table */
    CteUse *pCteUse;

    /* If pCte->zCteErr is non-NULL at this point, then this is an illegal
    ** recursive reference to CTE pCte. Leave an error in pParse and return
    ** early. If pCte->zCteErr is NULL, then this is not a recursive reference.
    ** In this case, proceed.  */
    if( pCte->zCteErr ){
      sqlite3ErrorMsg(pParse, pCte->zCteErr, pCte->zName);
      return 2;
    }
    if( cannotBeFunction(pParse, pFrom) ) return 2;

    assert( pFrom->pTab==0 );
    pTab = sqlite3DbMallocZero(db, sizeof(Table));
    if( pTab==0 ) return 2;
    pCteUse = pCte->pUse;
    if( pCteUse==0 ){
      pCte->pUse = pCteUse = sqlite3DbMallocZero(db, sizeof(pCteUse[0]));
      if( pCteUse==0
       || sqlite3ParserAddCleanup(pParse,sqlite3DbFree,pCteUse)==0
      ){
        sqlite3DbFree(db, pTab);
        return 2;
      }
      pCteUse->eM10d = pCte->eM10d;
    }
    pFrom->pTab = pTab;
    pTab->nTabRef = 1;
    pTab->zName = sqlite3DbStrDup(db, pCte->zName);
    pTab->iPKey = -1;
    pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
    pTab->tabFlags |= TF_Ephemeral | TF_NoVisibleRowid;
    pFrom->pSelect = sqlite3SelectDup(db, pCte->pSelect, 0);
    if( db->mallocFailed ) return 2;
    pFrom->pSelect->selFlags |= SF_CopyCte;
    assert( pFrom->pSelect );
    if( pFrom->fg.isIndexedBy ){
      sqlite3ErrorMsg(pParse, "no such index: \"%s\"", pFrom->u1.zIndexedBy);
      return 2;
    }
    pFrom->fg.isCte = 1;
    pFrom->u2.pCteUse = pCteUse;
    pCteUse->nUse++;
    if( pCteUse->nUse>=2 && pCteUse->eM10d==M10d_Any ){
      pCteUse->eM10d = M10d_Yes;
    }

    /* Check if this is a recursive CTE. */
    pRecTerm = pSel = pFrom->pSelect;
    bMayRecursive = ( pSel->op==TK_ALL || pSel->op==TK_UNION );
    while( bMayRecursive && pRecTerm->op==pSel->op ){
      int i;
      SrcList *pSrc = pRecTerm->pSrc;
      assert( pRecTerm->pPrior!=0 );
      for(i=0; i<pSrc->nSrc; i++){
        SrcItem *pItem = &pSrc->a[i];
        if( pItem->zDatabase==0
         && pItem->zName!=0
         && 0==sqlite3StrICmp(pItem->zName, pCte->zName)
        ){
          pItem->pTab = pTab;
          pTab->nTabRef++;
          pItem->fg.isRecursive = 1;
          if( pRecTerm->selFlags & SF_Recursive ){
            sqlite3ErrorMsg(pParse,
               "multiple references to recursive table: %s", pCte->zName
            );
            return 2;
          }
          pRecTerm->selFlags |= SF_Recursive;
          if( iRecTab<0 ) iRecTab = pParse->nTab++;
          pItem->iCursor = iRecTab;
        }
      }
      if( (pRecTerm->selFlags & SF_Recursive)==0 ) break;
      pRecTerm = pRecTerm->pPrior;
    }

    pCte->zCteErr = "circular reference: %s";
    pSavedWith = pParse->pWith;
    pParse->pWith = pWith;
    if( pSel->selFlags & SF_Recursive ){
      int rc;
      assert( pRecTerm!=0 );
      assert( (pRecTerm->selFlags & SF_Recursive)==0 );
      assert( pRecTerm->pNext!=0 );
      assert( (pRecTerm->pNext->selFlags & SF_Recursive)!=0 );
      assert( pRecTerm->pWith==0 );
      pRecTerm->pWith = pSel->pWith;
      rc = sqlite3WalkSelect(pWalker, pRecTerm);
      pRecTerm->pWith = 0;
      if( rc ){
        pParse->pWith = pSavedWith;
        return 2;
      }
    }else{
      if( sqlite3WalkSelect(pWalker, pSel) ){
        pParse->pWith = pSavedWith;
        return 2;
      }
    }
    pParse->pWith = pWith;

    for(pLeft=pSel; pLeft->pPrior; pLeft=pLeft->pPrior);
    pEList = pLeft->pEList;
    if( pCte->pCols ){
      if( pEList && pEList->nExpr!=pCte->pCols->nExpr ){
        sqlite3ErrorMsg(pParse, "table %s has %d values for %d columns",
            pCte->zName, pEList->nExpr, pCte->pCols->nExpr
        );
        pParse->pWith = pSavedWith;
        return 2;
      }
      pEList = pCte->pCols;
    }

    sqlite3ColumnsFromExprList(pParse, pEList, &pTab->nCol, &pTab->aCol);
    if( bMayRecursive ){
      if( pSel->selFlags & SF_Recursive ){
        pCte->zCteErr = "multiple recursive references: %s";
      }else{
        pCte->zCteErr = "recursive reference in a subquery: %s";
      }
      sqlite3WalkSelect(pWalker, pSel);
    }
    pCte->zCteErr = 0;
    pParse->pWith = pSavedWith;
    return 1;  /* Success */
  }
  return 0;  /* No match */
}